

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
* __thiscall
testing::internal::
TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::After(TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,ExpectationSet *s)

{
  Clause CVar1;
  bool bVar2;
  reference e;
  _Self local_60;
  _Self local_58;
  const_iterator it;
  allocator local_39;
  string local_38;
  ExpectationSet *local_18;
  ExpectationSet *s_local;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_18 = s;
  s_local = (ExpectationSet *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,
             ".After() cannot appear after .WillOnce(), .WillRepeatedly(), or .RetiresOnSaturation()."
             ,&local_39);
  ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,(int)CVar1 < 5,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_ExpectationBase).last_clause_ = kAfter;
  local_58._M_node = (_Base_ptr)ExpectationSet::begin(local_18);
  while( true ) {
    local_60._M_node = (_Base_ptr)ExpectationSet::end(local_18);
    bVar2 = std::operator!=(&local_58,&local_60);
    if (!bVar2) break;
    e = std::_Rb_tree_const_iterator<testing::Expectation>::operator*(&local_58);
    ExpectationSet::operator+=(&(this->super_ExpectationBase).immediate_prerequisites_,e);
    std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_58);
  }
  return this;
}

Assistant:

TypedExpectation& After(const ExpectationSet& s) {
    ExpectSpecProperty(last_clause_ <= kAfter,
                       ".After() cannot appear after .WillOnce(),"
                       " .WillRepeatedly(), or "
                       ".RetiresOnSaturation().");
    last_clause_ = kAfter;

    for (ExpectationSet::const_iterator it = s.begin(); it != s.end(); ++it) {
      immediate_prerequisites_ += *it;
    }
    return *this;
  }